

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_math_lang.cpp
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* Omega_h::math_lang::get_variables_used
            (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *expr)

{
  size_t string;
  allocator local_249;
  string local_248 [32];
  any local_228;
  undefined1 local_210 [8];
  SymbolSetReader reader;
  string *expr_local;
  
  reader.function_names._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)expr;
  SymbolSetReader::SymbolSetReader((SymbolSetReader *)local_210);
  string = reader.function_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"get_variables_used",&local_249);
  Reader::read_string(&local_228,(Reader *)local_210,(string *)string,(string *)local_248);
  any::~any(&local_228);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__,
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&reader.super_Reader.symbol_indentation_stack.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  SymbolSetReader::~SymbolSetReader((SymbolSetReader *)local_210);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> get_variables_used(std::string const& expr) {
  SymbolSetReader reader;
  reader.read_string(expr, "get_variables_used");
  return reader.variable_names;
}